

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O0

void show_includes(LexData *data)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 uVar3;
  size_type sVar4;
  const_reference pvVar5;
  __normal_iterator<PPIf_*,_std::vector<PPIf,_std::allocator<PPIf>_>_> *__i;
  reference pvVar6;
  char *pcVar7;
  bool bVar8;
  int local_158;
  allocator<char> local_151;
  int i_1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  string local_130 [8];
  string str;
  __normal_iterator<PPIf_*,_std::vector<PPIf,_std::allocator<PPIf>_>_> local_108;
  const_iterator local_100;
  allocator<char> local_f1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  string local_d0 [8];
  string id;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  string local_88 [8];
  string lit;
  undefined1 local_60 [7];
  bool first;
  PPIf ppif;
  int i;
  undefined1 local_28 [8];
  vector<PPIf,_std::allocator<PPIf>_> stack;
  LexData *data_local;
  
  stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)data;
  std::vector<PPIf,_std::allocator<PPIf>_>::vector((vector<PPIf,_std::allocator<PPIf>_> *)local_28);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s: includes\n",uVar3);
  ppif.def = false;
  ppif._33_3_ = 0;
  for (; iVar2 = ppif._32_4_ + 2,
      sVar4 = std::vector<Token,_std::allocator<Token>_>::size
                        ((vector<Token,_std::allocator<Token>_> *)
                         (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 2)), iVar2 < (int)sVar4;
      ppif._32_4_ = ppif._32_4_ + 1) {
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       ((vector<Token,_std::allocator<Token>_> *)
                        (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 2),(long)(int)ppif._32_4_);
    if ((pvVar5->kind == PPBegin) &&
       (pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           ((vector<Token,_std::allocator<Token>_> *)
                            (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 2),(long)(ppif._32_4_ + 1))
       , pvVar5->kind == PPKeyword)) {
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         ((vector<Token,_std::allocator<Token>_> *)
                          (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 2),(long)(ppif._32_4_ + 1));
      if ((pvVar5->i == 5) ||
         ((pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                              ((vector<Token,_std::allocator<Token>_> *)
                               (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 2),
                               (long)(ppif._32_4_ + 1)), pvVar5->i == 6 ||
          (pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                              ((vector<Token,_std::allocator<Token>_> *)
                               (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 2),
                               (long)(ppif._32_4_ + 1)), pvVar5->i == 7)))) {
        PPIf::PPIf((PPIf *)local_60);
        pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           ((vector<Token,_std::allocator<Token>_> *)
                            (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 2),(long)(ppif._32_4_ + 1))
        ;
        if (pvVar5->i == 5) {
          lit.field_2._M_local_buf[0xf] = '\0';
          std::__cxx11::string::operator=((string *)local_60,"#if (");
          ppif._32_4_ = ppif._32_4_ + 2;
          while( true ) {
            uVar1 = ppif._32_4_;
            sVar4 = std::vector<Token,_std::allocator<Token>_>::size
                              ((vector<Token,_std::allocator<Token>_> *)
                               (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 2));
            bVar8 = false;
            if ((int)uVar1 < (int)sVar4) {
              pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                 ((vector<Token,_std::allocator<Token>_> *)
                                  (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 2),
                                  (long)(int)ppif._32_4_);
              bVar8 = pvVar5->kind != PPEnd;
            }
            if (!bVar8) break;
            pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                               ((vector<Token,_std::allocator<Token>_> *)
                                (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 2),
                                (long)(int)ppif._32_4_);
            if ((pvVar5->kind == Identifier) ||
               (pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                   ((vector<Token,_std::allocator<Token>_> *)
                                    (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 2),
                                    (long)(int)ppif._32_4_), pvVar5->kind == Literal)) {
              local_98._M_current =
                   (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage)->def);
              pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                 ((vector<Token,_std::allocator<Token>_> *)
                                  (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 2),
                                  (long)(int)ppif._32_4_);
              local_90 = __gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_98,(long)pvVar5->i);
              local_a8._M_current =
                   (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage)->def);
              pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                 ((vector<Token,_std::allocator<Token>_> *)
                                  (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 2),
                                  (long)(int)ppif._32_4_);
              local_a0 = __gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_a8,(long)pvVar5->j);
              std::allocator<char>::allocator();
              std::__cxx11::string::
              string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                        (local_88,local_90,local_a0,
                         (allocator<char> *)(id.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(id.field_2._M_local_buf + 0xf));
              if ((lit.field_2._M_local_buf[0xf] & 1U) == 0) {
                std::__cxx11::string::push_back((char)local_60);
              }
              else {
                lit.field_2._M_local_buf[0xf] = '\0';
              }
              std::__cxx11::string::operator+=((string *)local_60,local_88);
              std::__cxx11::string::~string(local_88);
            }
            ppif._32_4_ = ppif._32_4_ + 1;
          }
          std::__cxx11::string::operator+=((string *)local_60,")");
          ppif.id.field_2._M_local_buf[8] = '\x01';
        }
        else if (pvVar5->i - 6U < 2) {
          local_e0._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage)->def);
          pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             ((vector<Token,_std::allocator<Token>_> *)
                              (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 2),
                              (long)(ppif._32_4_ + 2));
          local_d8 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator+(&local_e0,(long)pvVar5->i);
          local_f0._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage)->def);
          pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             ((vector<Token,_std::allocator<Token>_> *)
                              (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 2),
                              (long)(ppif._32_4_ + 2));
          local_e8 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator+(&local_f0,(long)pvVar5->j);
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (local_d0,local_d8,local_e8,&local_f1);
          std::allocator<char>::~allocator(&local_f1);
          std::__cxx11::string::operator=((string *)local_60,local_d0);
          pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             ((vector<Token,_std::allocator<Token>_> *)
                              (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 2),
                              (long)(ppif._32_4_ + 1));
          ppif.id.field_2._M_local_buf[8] = pvVar5->i == 6;
          std::__cxx11::string::~string(local_d0);
        }
        std::vector<PPIf,_std::allocator<PPIf>_>::push_back
                  ((vector<PPIf,_std::allocator<PPIf>_> *)local_28,(value_type *)local_60);
        PPIf::~PPIf((PPIf *)local_60);
      }
      else {
        pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           ((vector<Token,_std::allocator<Token>_> *)
                            (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 2),(long)(ppif._32_4_ + 1))
        ;
        if (pvVar5->i == 3) {
          bVar8 = std::vector<PPIf,_std::allocator<PPIf>_>::empty
                            ((vector<PPIf,_std::allocator<PPIf>_> *)local_28);
          if (!bVar8) {
            local_108._M_current =
                 (PPIf *)std::vector<PPIf,_std::allocator<PPIf>_>::end
                                   ((vector<PPIf,_std::allocator<PPIf>_> *)local_28);
            __i = __gnu_cxx::__normal_iterator<PPIf_*,_std::vector<PPIf,_std::allocator<PPIf>_>_>::
                  operator--(&local_108);
            __gnu_cxx::__normal_iterator<PPIf_const*,std::vector<PPIf,std::allocator<PPIf>>>::
            __normal_iterator<PPIf*>
                      ((__normal_iterator<PPIf_const*,std::vector<PPIf,std::allocator<PPIf>>> *)
                       &local_100,__i);
            str.field_2._8_8_ =
                 std::vector<PPIf,_std::allocator<PPIf>_>::erase
                           ((vector<PPIf,_std::allocator<PPIf>_> *)local_28,local_100);
          }
        }
        else {
          pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             ((vector<Token,_std::allocator<Token>_> *)
                              (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 2),
                              (long)(ppif._32_4_ + 1));
          if ((pvVar5->i == 8) &&
             (pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                 ((vector<Token,_std::allocator<Token>_> *)
                                  (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 2),
                                  (long)(ppif._32_4_ + 2)), pvVar5->kind == PPHeaderName)) {
            local_140._M_current =
                 (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage)->def);
            pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                               ((vector<Token,_std::allocator<Token>_> *)
                                (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 2),
                                (long)(ppif._32_4_ + 2));
            local_138 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_140,(long)pvVar5->i);
            _i_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)->def);
            pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                               ((vector<Token,_std::allocator<Token>_> *)
                                (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 2),
                                (long)(ppif._32_4_ + 2));
            local_148 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)&i_1,(long)pvVar5->j);
            std::allocator<char>::allocator();
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      (local_130,local_138,local_148,&local_151);
            std::allocator<char>::~allocator(&local_151);
            uVar3 = std::__cxx11::string::c_str();
            printf("  %s",uVar3);
            bVar8 = std::vector<PPIf,_std::allocator<PPIf>_>::empty
                              ((vector<PPIf,_std::allocator<PPIf>_> *)local_28);
            if (!bVar8) {
              printf(" (");
              for (local_158 = 0;
                  sVar4 = std::vector<PPIf,_std::allocator<PPIf>_>::size
                                    ((vector<PPIf,_std::allocator<PPIf>_> *)local_28),
                  local_158 < (int)sVar4; local_158 = local_158 + 1) {
                if (0 < local_158) {
                  printf(" && ");
                }
                pvVar6 = std::vector<PPIf,_std::allocator<PPIf>_>::operator[]
                                   ((vector<PPIf,_std::allocator<PPIf>_> *)local_28,(long)local_158)
                ;
                pcVar7 = "!";
                if ((pvVar6->def & 1U) != 0) {
                  pcVar7 = "";
                }
                std::vector<PPIf,_std::allocator<PPIf>_>::operator[]
                          ((vector<PPIf,_std::allocator<PPIf>_> *)local_28,(long)local_158);
                uVar3 = std::__cxx11::string::c_str();
                printf("%s%s",pcVar7,uVar3);
              }
              printf(")");
            }
            printf("\n");
            std::__cxx11::string::~string(local_130);
          }
        }
      }
    }
  }
  std::vector<PPIf,_std::allocator<PPIf>_>::~vector((vector<PPIf,_std::allocator<PPIf>_> *)local_28)
  ;
  return;
}

Assistant:

void show_includes(const LexData& data)
{
  std::vector<PPIf> stack;

  std::printf("%s: includes\n",
              data.fn.c_str());

  for (int i=0; i+2<int(data.tokens.size()); ++i) {
    if (data.tokens[i].kind == TokenKind::PPBegin &&
        data.tokens[i+1].kind == TokenKind::PPKeyword) {
      if (data.tokens[i+1].i == pp_key_if ||
          data.tokens[i+1].i == pp_key_ifdef ||
          data.tokens[i+1].i == pp_key_ifndef) {
        PPIf ppif;
        switch (data.tokens[i+1].i) {
          case pp_key_if: {
            bool first = false;
            ppif.id = "#if (";
            for (i+=2; i<int(data.tokens.size()) &&
                   data.tokens[i].kind != TokenKind::PPEnd; ++i) {
              if (data.tokens[i].kind == TokenKind::Identifier ||
                  data.tokens[i].kind == TokenKind::Literal) {
                std::string lit(data.ids.begin()+data.tokens[i].i,
                                data.ids.begin()+data.tokens[i].j);
                if (first)
                  first = false;
                else
                  ppif.id.push_back(' ');
                ppif.id += lit;
              }
            }
            ppif.id += ")";
            ppif.def = true;
            break;
          }
          case pp_key_ifndef:
          case pp_key_ifdef: {
            std::string id(data.ids.begin()+data.tokens[i+2].i,
                           data.ids.begin()+data.tokens[i+2].j);
            ppif.id = id;
            ppif.def = (data.tokens[i+1].i == pp_key_ifdef);
            break;
          }
        }
        stack.push_back(ppif);
      }
      else if (data.tokens[i+1].i == pp_key_endif) {
        if (!stack.empty())
          stack.erase(--stack.end());
      }
      else if (data.tokens[i+1].i == pp_key_include &&
               data.tokens[i+2].kind == TokenKind::PPHeaderName) {
        std::string str(data.ids.begin()+data.tokens[i+2].i,
                        data.ids.begin()+data.tokens[i+2].j);
        std::printf("  %s", str.c_str());
        if (!stack.empty()) {
          std::printf(" (");
          for (int i=0; i<int(stack.size()); ++i) {
            if (i > 0)
              std::printf(" && ");
            std::printf("%s%s",
                        stack[i].def ? "": "!",
                        stack[i].id.c_str());
          }
          std::printf(")");
        }
        std::printf("\n");
      }
    }
  }
}